

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O3

bool vera::loadOBJ(string *_filename,Scene *_scene,bool _verbose)

{
  size_type *psVar1;
  ulong *puVar2;
  MaterialsMap *pMVar3;
  int iVar4;
  int iVar5;
  _Rb_tree_color _Var6;
  char *pcVar7;
  pointer pcVar8;
  pointer puVar9;
  pointer piVar10;
  MaterialsMap *pMVar11;
  bool bVar12;
  ostream *poVar13;
  size_t sVar14;
  iterator iVar15;
  Material *pMVar16;
  mapped_type *ppMVar17;
  pointer paVar18;
  undefined8 *puVar19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  mapped_type *pmVar22;
  mapped_type *_normal;
  pointer paVar23;
  undefined7 in_register_00000011;
  _Base_ptr p_Var24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  undefined8 uVar28;
  _Base_ptr p_Var29;
  ulong uVar30;
  ulong uVar31;
  _Base_ptr *pp_Var32;
  uint32_t _i;
  long lVar33;
  int mCounter;
  string meshName;
  unsigned_long local_318;
  uint local_310;
  int local_30c;
  ulong *local_308;
  long local_300;
  ulong local_2f8;
  undefined8 uStack_2f0;
  Scene *local_2e8;
  string local_2e0;
  uint local_2bc;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  int vi;
  undefined4 uStack_274;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
  unique_indices;
  string name;
  Material *local_208;
  map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  smoothVertexNormals;
  string err;
  string warn;
  attrib_t attrib;
  string base_dir;
  Mesh mesh;
  
  local_2e8 = _scene;
  memset(&attrib,0,0x90);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&mesh,(_filename->_M_dataplus)._M_p,(allocator *)&smoothVertexNormals);
  getBaseDir(&base_dir,(string *)&mesh);
  if ((pointer *)mesh._vptr_Mesh !=
      &mesh.m_colors.
       super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(mesh._vptr_Mesh);
  }
  bVar12 = tinyobj::LoadObj(&attrib,&shapes,&materials,&warn,&err,(_filename->_M_dataplus)._M_p,
                            base_dir._M_dataplus._M_p,true,true);
  if (warn._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WARN: ",6);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,warn._M_dataplus._M_p,warn._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  if (err._M_string_length != 0) {
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,err._M_dataplus._M_p,err._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  if (bVar12) {
    if (_verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Loading ",8);
      pcVar7 = (_filename->_M_dataplus)._M_p;
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x455ea0);
      }
      else {
        sVar14 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar14);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      printf("    Total vertices  = %d\n",
             (ulong)(uint)((int)((ulong)((long)attrib.vertices.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)attrib.vertices.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 2) / 3));
      printf("    Total colors    = %d\n",
             (ulong)(uint)((int)((ulong)((long)attrib.colors.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)attrib.colors.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 2) / 3));
      printf("    Total normals   = %d\n",
             (ulong)(uint)((int)((ulong)((long)attrib.normals.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)attrib.normals.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 2) / 3));
      printf("    Total texcoords = %d\n",
             (ulong)(uint)((int)(((uint)((ulong)((long)attrib.texcoords.
                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                (long)attrib.texcoords.
                                                                                                            
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 0x21)
                                 & 1) + (int)((ulong)((long)attrib.texcoords.
                                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)attrib.texcoords.
                                                                                                                
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2))
                          >> 1));
      printf("    Total materials = %d\n",
             (ulong)(uint)((int)((ulong)((long)materials.
                                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)materials.
                                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          0x1fdcd759));
      printf("    Total shapes    = %d\n",
             (ulong)(uint)((int)((ulong)((long)shapes.
                                               super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)shapes.
                                              super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                          -0x49249249));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Shapes: ",8);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
    }
    local_310 = (uint)CONCAT71(in_register_00000011,_verbose);
    if (materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pMVar3 = &local_2e8->materials;
      pMVar11 = &local_2e8->materials;
      lVar33 = 0;
      uVar31 = 0;
      do {
        iVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::find(&pMVar3->_M_t,
                        (key_type *)
                        ((long)(materials.
                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                ._M_impl.super__Vector_impl_data._M_start)->ambient + lVar33 + -0x20
                        ));
        if ((_Rb_tree_header *)iVar15._M_node == &(pMVar11->_M_t)._M_impl.super__Rb_tree_header) {
          if ((char)local_310 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Add Material ",0xd);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 *(char **)((long)(materials.
                                                                                                      
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  ambient + lVar33 + -0x20),
                                 *(long *)((long)(materials.
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 ambient + lVar33 + -0x18));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
          }
          pMVar16 = InitMaterial((material_t *)
                                 ((long)(materials.
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->ambient +
                                 lVar33 + -0x20),local_2e8,&base_dir);
          ppMVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                     ::operator[](pMVar3,(key_type *)
                                         ((long)(materials.
                                                 super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->ambient
                                         + lVar33 + -0x20));
          *ppMVar17 = pMVar16;
        }
        uVar31 = uVar31 + 1;
        lVar33 = lVar33 + 0x748;
      } while (uVar31 < (ulong)(((long)materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x63fb9aeb1fdcd759));
    }
    local_318 = 0;
    if (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pMVar3 = &local_2e8->materials;
      pMVar11 = &local_2e8->materials;
      uVar25 = local_310;
      do {
        pp_Var32 = &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        name._M_dataplus._M_p = (pointer)&name.field_2;
        pcVar8 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_318].name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&name,pcVar8,
                   pcVar8 + shapes.
                            super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                            _M_impl.super__Vector_impl_data._M_start[local_318].name.
                            _M_string_length);
        if (name._M_string_length == 0) {
          toString<unsigned_long>((string *)&mesh,&local_318);
          std::__cxx11::string::operator=((string *)&name,(string *)&mesh);
          if ((pointer *)mesh._vptr_Mesh !=
              &mesh.m_colors.
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
            operator_delete(mesh._vptr_Mesh);
          }
        }
        if ((char)uVar25 != '\0') {
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,name._M_dataplus._M_p,name._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
        }
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        puVar9 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_318].mesh.smoothing_group_ids.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar33 = (long)shapes.
                       super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                       _M_impl.super__Vector_impl_data._M_start[local_318].mesh.smoothing_group_ids.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar9;
        smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (lVar33 != 0) {
          uVar31 = lVar33 >> 2;
          if (*puVar9 == 0) {
            uVar27 = 1;
            do {
              uVar30 = uVar27;
              if (uVar31 + (uVar31 == 0) == uVar30) break;
              uVar27 = uVar30 + 1;
            } while (puVar9[uVar30] == 0);
            if (uVar31 <= uVar30) goto LAB_002a7281;
          }
          if ((char)uVar25 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    . Compute smoothingNormal",0x1d);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
            std::ostream::put(-0x28);
            std::ostream::flush();
          }
          computeSmoothingNormals
                    (&attrib,shapes.
                             super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_318,
                     &smoothVertexNormals);
        }
LAB_002a7281:
        Mesh::Mesh(&mesh);
        mesh.m_drawMode = TRIANGLES;
        unique_indices._M_t._M_impl._0_8_ = pp_Var32;
        std::__cxx11::string::_M_construct<char_const*>((string *)&unique_indices,"default","");
        iVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::find(&pMVar3->_M_t,(key_type *)&unique_indices);
        if ((_Base_ptr *)unique_indices._M_t._M_impl._0_8_ != pp_Var32) {
          operator_delete((void *)unique_indices._M_t._M_impl._0_8_);
        }
        if ((_Rb_tree_header *)iVar15._M_node == &(pMVar11->_M_t)._M_impl.super__Rb_tree_header) {
          pMVar16 = (Material *)operator_new(0x150);
          unique_indices._M_t._M_impl._0_8_ = pp_Var32;
          std::__cxx11::string::_M_construct<char_const*>((string *)&unique_indices,"default","");
          Material::Material(pMVar16,(key_type *)&unique_indices);
          meshName._M_dataplus._M_p = (pointer)&meshName.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&meshName,"default","");
          ppMVar17 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                     ::operator[](pMVar3,&meshName);
          *ppMVar17 = pMVar16;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)meshName._M_dataplus._M_p != &meshName.field_2) {
            operator_delete(meshName._M_dataplus._M_p);
          }
          if ((_Base_ptr *)unique_indices._M_t._M_impl._0_8_ != pp_Var32) {
            operator_delete((void *)unique_indices._M_t._M_impl._0_8_);
          }
        }
        unique_indices._M_t._M_impl._0_8_ = pp_Var32;
        std::__cxx11::string::_M_construct<char_const*>((string *)&unique_indices,"default","");
        ppMVar17 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                   ::operator[](pMVar3,(key_type *)&unique_indices);
        local_208 = *ppMVar17;
        if ((_Base_ptr *)unique_indices._M_t._M_impl._0_8_ != pp_Var32) {
          operator_delete((void *)unique_indices._M_t._M_impl._0_8_);
        }
        unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header;
        unique_indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mCounter = 0;
        paVar23 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[local_318].mesh.indices.
                  super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_2bc = uVar25 & 0xff;
        unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
            super__Vector_impl_data._M_start[local_318].mesh.indices.
            super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_finish != paVar23) {
          paVar18 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_start + local_318;
          _i = 0;
          iVar26 = -1;
          uVar31 = 0;
          do {
            vi = paVar23[uVar31].vertex_index;
            iVar4 = paVar23[uVar31].normal_index;
            local_30c = paVar23[uVar31].texcoord_index;
            piVar10 = (paVar18->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (((paVar18->mesh).material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish != piVar10) &&
               (iVar5 = piVar10[(int)(uVar31 / 3)], iVar26 != iVar5)) {
              if ((iVar26 != -1) &&
                 (mesh.m_vertices.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  mesh.m_vertices.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)) {
                local_308 = &local_2f8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_308,name._M_dataplus._M_p,
                           name._M_dataplus._M_p + name._M_string_length);
                std::__cxx11::string::append((char *)&local_308);
                toString<int>(&local_2e0,&mCounter,3,'0');
                uVar27 = 0xf;
                if (local_308 != &local_2f8) {
                  uVar27 = local_2f8;
                }
                if (uVar27 < local_2e0._M_string_length + local_300) {
                  uVar28 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                    uVar28 = local_2e0.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar28 < local_2e0._M_string_length + local_300) goto LAB_002a7540;
                  puVar19 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_2e0,0,(char *)0x0,(ulong)local_308);
                }
                else {
LAB_002a7540:
                  puVar19 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_308,(ulong)local_2e0._M_dataplus._M_p);
                }
                psVar1 = puVar19 + 2;
                if ((size_type *)*puVar19 == psVar1) {
                  meshName.field_2._M_allocated_capacity = *psVar1;
                  meshName.field_2._8_8_ = puVar19[3];
                  meshName._M_dataplus._M_p = (pointer)&meshName.field_2;
                }
                else {
                  meshName.field_2._M_allocated_capacity = *psVar1;
                  meshName._M_dataplus._M_p = (pointer)*puVar19;
                }
                meshName._M_string_length = puVar19[1];
                *puVar19 = psVar1;
                puVar19[1] = 0;
                *(char *)psVar1 = '\0';
                addModel(local_2e8,&meshName,&mesh,local_208,SUB41(local_2bc,0));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)meshName._M_dataplus._M_p != &meshName.field_2) {
                  operator_delete(meshName._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                  operator_delete(local_2e0._M_dataplus._M_p);
                }
                if (local_308 != &local_2f8) {
                  operator_delete(local_308);
                }
                mCounter = mCounter + 1;
                Mesh::clear(&mesh);
                std::
                _Rb_tree<int,_std::pair<const_int,_tinyobj::index_t>,_std::_Select1st<std::pair<const_int,_tinyobj::index_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                ::clear(&unique_indices._M_t);
                _i = 0;
              }
              ppMVar17 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                         ::operator[](pMVar3,&materials.
                                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start[iVar5].name)
              ;
              local_208 = *ppMVar17;
              iVar26 = iVar5;
            }
            if (unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
                (_Base_ptr)0x0) {
LAB_002a76d1:
              pmVar22 = std::
                        map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                        ::operator[](&unique_indices,&vi);
              pmVar22->vertex_index = _i;
              pmVar22 = std::
                        map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                        ::operator[](&unique_indices,&vi);
              pmVar22->normal_index = iVar4;
              pmVar22 = std::
                        map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                        ::operator[](&unique_indices,&vi);
              pmVar22->texcoord_index = local_30c;
              meshName._M_dataplus._M_p =
                   *(pointer *)
                    (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)vi * 3);
              meshName._M_string_length =
                   CONCAT44(meshName._M_string_length._4_4_,
                            attrib.vertices.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start[(long)vi * 3 + 2]);
              Mesh::addVertex(&mesh,(vec3 *)&meshName);
              meshName._M_dataplus._M_p =
                   *(pointer *)
                    (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)vi * 3);
              meshName._M_string_length =
                   CONCAT44(0x3f800000,
                            attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)vi * 3 + 2]);
              Mesh::addColor(&mesh,(vec4 *)&meshName);
              if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                if ((smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
                   (smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                    (_Base_ptr)0x0)) {
                  p_Var21 = smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent;
                  p_Var29 = &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header;
                  do {
                    p_Var20 = p_Var29;
                    p_Var24 = p_Var21;
                    _Var6 = p_Var24[1]._M_color;
                    p_Var29 = p_Var24;
                    if ((int)_Var6 < vi) {
                      p_Var29 = p_Var20;
                    }
                    p_Var21 = (&p_Var24->_M_left)[(int)_Var6 < vi];
                  } while ((&p_Var24->_M_left)[(int)_Var6 < vi] != (_Base_ptr)0x0);
                  if ((_Rb_tree_header *)p_Var29 !=
                      &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header) {
                    if ((int)_Var6 < vi) {
                      p_Var24 = p_Var20;
                    }
                    if ((int)p_Var24[1]._M_color <= vi) {
                      _normal = std::
                                map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                                ::at(&smoothVertexNormals,&vi);
                      Mesh::addNormal(&mesh,_normal);
                    }
                  }
                }
              }
              else {
                meshName._M_dataplus._M_p =
                     *(pointer *)
                      (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + (long)iVar4 * 3);
                meshName._M_string_length =
                     CONCAT44(meshName._M_string_length._4_4_,
                              attrib.normals.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start[(long)iVar4 * 3 + 2]);
                Mesh::addNormal(&mesh,(vec3 *)&meshName);
              }
              if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                meshName._M_dataplus._M_p =
                     (pointer)CONCAT44(1.0 - attrib.texcoords.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start
                                             [local_30c * 2 + 1],
                                       attrib.texcoords.
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_start[(long)local_30c * 2]);
                Mesh::addTexCoord(&mesh,(vec2 *)&meshName);
              }
              Mesh::addIndex(&mesh,_i);
              _i = _i + 1;
            }
            else {
              p_Var21 = &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header;
              p_Var29 = unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var24 = p_Var29;
                p_Var20 = p_Var21;
                _Var6 = p_Var24[1]._M_color;
                p_Var21 = p_Var24;
                if ((int)_Var6 < vi) {
                  p_Var21 = p_Var20;
                }
                p_Var29 = (&p_Var24->_M_left)[(int)_Var6 < vi];
              } while ((&p_Var24->_M_left)[(int)_Var6 < vi] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var21 == &unique_indices._M_t._M_impl.super__Rb_tree_header)
              goto LAB_002a76d1;
              if ((int)_Var6 < vi) {
                p_Var24 = p_Var20;
              }
              if (((vi < (int)p_Var24[1]._M_color) || (*(int *)&p_Var21[1]._M_parent != iVar4)) ||
                 (*(int *)((long)&p_Var21[1]._M_parent + 4) != local_30c)) goto LAB_002a76d1;
              Mesh::addIndex(&mesh,*(uint32_t *)&p_Var21[1].field_0x4);
            }
            uVar31 = uVar31 + 1;
            paVar18 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_318;
            paVar23 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_318].mesh.indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar31 < (ulong)(((long)shapes.
                                           super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_318].mesh
                                           .indices.
                                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)paVar23 >> 2) * -0x5555555555555555));
        }
        meshName._M_dataplus._M_p = (pointer)&meshName.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&meshName,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        uVar25 = local_310;
        if (0 < mCounter) {
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e0,name._M_dataplus._M_p,
                     name._M_dataplus._M_p + name._M_string_length);
          std::__cxx11::string::append((char *)&local_2e0);
          toString<int>((string *)&vi,&mCounter,3,'0');
          uVar28 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            uVar28 = local_2e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar28 < local_270 + local_2e0._M_string_length) {
            uVar28 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(uStack_274,vi) != &local_268) {
              uVar28 = local_268._M_allocated_capacity;
            }
            if ((ulong)uVar28 < local_270 + local_2e0._M_string_length) goto LAB_002a7a12;
            puVar19 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&vi,0,(char *)0x0,(ulong)local_2e0._M_dataplus._M_p);
          }
          else {
LAB_002a7a12:
            puVar19 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_2e0,CONCAT44(uStack_274,vi));
          }
          puVar2 = puVar19 + 2;
          if ((ulong *)*puVar19 == puVar2) {
            local_2f8 = *puVar2;
            uStack_2f0 = puVar19[3];
            local_308 = &local_2f8;
          }
          else {
            local_2f8 = *puVar2;
            local_308 = (ulong *)*puVar19;
          }
          local_300 = puVar19[1];
          *puVar19 = puVar2;
          puVar19[1] = 0;
          *(undefined1 *)puVar2 = 0;
          std::__cxx11::string::operator=((string *)&meshName,(string *)&local_308);
          if (local_308 != &local_2f8) {
            operator_delete(local_308);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_274,vi) != &local_268) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_274,vi));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p);
          }
        }
        addModel(local_2e8,&meshName,&mesh,local_208,SUB41(local_2bc,0));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)meshName._M_dataplus._M_p != &meshName.field_2) {
          operator_delete(meshName._M_dataplus._M_p);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_tinyobj::index_t>,_std::_Select1st<std::pair<const_int,_tinyobj::index_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
        ::~_Rb_tree(&unique_indices._M_t);
        Mesh::~Mesh(&mesh);
        std::
        _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
        ::~_Rb_tree(&smoothVertexNormals._M_t);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p);
        }
        local_318 = local_318 + 1;
      } while (local_318 <
               (ulong)(((long)shapes.
                              super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)shapes.
                              super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) * 0x6db6db6db6db6db7))
      ;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to load ",0xf);
    pcVar7 = (_filename->_M_dataplus)._M_p;
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x455ea0);
    }
    else {
      sVar14 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar14);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base_dir._M_dataplus._M_p != &base_dir.field_2) {
    operator_delete(base_dir._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)err._M_dataplus._M_p != &err.field_2) {
    operator_delete(err._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)warn._M_dataplus._M_p != &warn.field_2) {
    operator_delete(warn._M_dataplus._M_p);
  }
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
  if (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar12;
}

Assistant:

bool loadOBJ(const std::string& _filename, Scene* _scene, bool _verbose) {
    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;
    std::string base_dir = getBaseDir(_filename.c_str());
    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, _filename.c_str(), base_dir.c_str());

    if (!warn.empty()) {
        std::cout << "WARN: " << warn << std::endl;
    }
    if (!err.empty()) {
        std::cerr << err << std::endl;
    }
    if (!ret) {
        std::cerr << "Failed to load " << _filename.c_str() << std::endl;
        return false;
    }

    // Append `default` material
    // materials.push_back(tinyobj::material_t());

    if (_verbose) {
        std::cerr << "Loading " << _filename.c_str() << std::endl;
        printf("    Total vertices  = %d\n", (int)(attrib.vertices.size()) / 3);
        printf("    Total colors    = %d\n", (int)(attrib.colors.size()) / 3);
        printf("    Total normals   = %d\n", (int)(attrib.normals.size()) / 3);
        printf("    Total texcoords = %d\n", (int)(attrib.texcoords.size()) / 2);
        printf("    Total materials = %d\n", (int)materials.size());
        printf("    Total shapes    = %d\n", (int)shapes.size());

        std::cerr << "Shapes: " << std::endl;
    }

    for (size_t m = 0; m < materials.size(); m++) {
        if ( _scene->materials.find( materials[m].name ) == _scene->materials.end() ) {
            if (_verbose)
                std::cout << "Add Material " << materials[m].name << std::endl;

            _scene->materials[ materials[m].name ] = InitMaterial( materials[m], _scene, base_dir );
        }
    }

    for (size_t s = 0; s < shapes.size(); s++) {
        std::string name = shapes[s].name;
        if (name.empty())
            name = toString(s);

        if (_verbose)
            std::cerr << name << std::endl;

        // Check for smoothing group and compute smoothing normals
        std::map<int, glm::vec3> smoothVertexNormals;
        if (hasSmoothingGroup(shapes[s]) > 0) {
            if (_verbose)
                std::cout << "    . Compute smoothingNormal" << std::endl;
            computeSmoothingNormals(attrib, shapes[s], smoothVertexNormals);
        }

        Mesh mesh;
        mesh.setDrawMode(TRIANGLES);

        if (_scene->materials.find("default") == _scene->materials.end())
            _scene->materials["default"] = new Material("default");
        
        Material* mat = _scene->materials["default"];

        std::map<int, tinyobj::index_t> unique_indices;
        std::map<int, tinyobj::index_t>::iterator iter;
        
        int mi = -1;
        int mCounter = 0;
        INDEX_TYPE iCounter = 0;
        for (size_t i = 0; i < shapes[s].mesh.indices.size(); i++) {
            int f = (int)floor(i/3);

            tinyobj::index_t index = shapes[s].mesh.indices[i];
            int vi = index.vertex_index;
            int ni = index.normal_index;
            int ti = index.texcoord_index;

            // Associate w material
            if (shapes[s].mesh.material_ids.size() > 0) {
                int material_index = shapes[s].mesh.material_ids[f];
                if (mi != material_index) {

                    // If there is a switch of material start a new mesh
                    if (mi != -1 && mesh.getVertices().size() > 0) {

                        // std::cout << "Adding model " << name  << "_" << toString(mCounter, 3, '0') << " w new material " << mat.name << std::endl;
                        
                        // Add the model to the stack 
                        addModel(_scene, name + "_"+ toString(mCounter,3,'0'), mesh, mat, _verbose);
                        mCounter++;

                        // Restart the mesh
                        iCounter = 0;
                        mesh.clear();
                        unique_indices.clear();
                    }

                    // assign the current material
                    mi = material_index;
                    mat = _scene->materials[ materials[material_index].name ];
                }
            }

            bool reuse = false;
            iter = unique_indices.find(vi);

                        // if already exist 
            if (iter != unique_indices.end())
                // and have the same attributes
                if ((iter->second.normal_index == ni) &&
                    (iter->second.texcoord_index == ti) )
                    reuse = true;
            
            // Re use the vertex
            if (reuse)
                mesh.addIndex( (INDEX_TYPE)iter->second.vertex_index );
            // Other wise create a new one
            else {
                unique_indices[vi].vertex_index = (int)iCounter;
                unique_indices[vi].normal_index = ni;
                unique_indices[vi].texcoord_index = ti;
                
                mesh.addVertex( getVertex(attrib, vi) );
                mesh.addColor( getColor(attrib, vi) );

                // If there is normals add them
                if (attrib.normals.size() > 0)
                    mesh.addNormal( getNormal(attrib, ni) );

                else if (smoothVertexNormals.size() > 0)
                    if ( smoothVertexNormals.find(vi) != smoothVertexNormals.end() )
                        mesh.addNormal( smoothVertexNormals.at(vi) );

                // If there is texcoords add them
                if (attrib.texcoords.size() > 0)
                    mesh.addTexCoord( getTexCoords(attrib, ti) );

                mesh.addIndex( iCounter++ );
            }
        }

        std::string meshName = name;
        if (mCounter > 0)
            meshName = name + "_" + toString(mCounter, 3, '0');

        // std::cout << "Adding model " << meshName << " w material " << mat.name << std::endl;
        addModel(_scene, meshName, mesh, mat, _verbose);
    }

    return true;
}